

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.hpp
# Opt level: O0

SPIRVShaderResourceAttribs * __thiscall
Diligent::SPIRVShaderResources::GetResAttribs
          (SPIRVShaderResources *this,Uint32 n,Uint32 NumResources,Uint32 Offset)

{
  Char *pCVar1;
  pointer pvVar2;
  uint *in_R9;
  undefined1 local_60 [8];
  string msg_1;
  string msg;
  Uint32 local_18;
  Uint32 Offset_local;
  Uint32 NumResources_local;
  Uint32 n_local;
  SPIRVShaderResources *this_local;
  
  local_18 = NumResources;
  Offset_local = n;
  _NumResources_local = this;
  if (NumResources <= n) {
    FormatString<char[17],unsigned_int,char[42],unsigned_int>
              ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Resource index (",
               (char (*) [17])&Offset_local,(uint *)") is out of range. Total resource count: ",
               (char (*) [42])&local_18,in_R9);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetResAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0x15c);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  if ((uint)this->m_TotalResources <= Offset + Offset_local) {
    FormatString<char[26],char[30]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Offset + n < m_TotalResources",
               (char (*) [30])(ulong)this->m_TotalResources);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetResAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0x15d);
    std::__cxx11::string::~string((string *)local_60);
  }
  pvVar2 = std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                     (&this->m_MemoryBuffer);
  return (SPIRVShaderResourceAttribs *)((long)pvVar2 + (ulong)(Offset + Offset_local) * 0x20);
}

Assistant:

SPIRVShaderResourceAttribs& GetResAttribs(Uint32 n, Uint32 NumResources, Uint32 Offset) noexcept
    {
        VERIFY(n < NumResources, "Resource index (", n, ") is out of range. Total resource count: ", NumResources);
        VERIFY_EXPR(Offset + n < m_TotalResources);
        return reinterpret_cast<SPIRVShaderResourceAttribs*>(m_MemoryBuffer.get())[Offset + n];
    }